

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O2

double __thiscall Graph::getSum(Graph *this)

{
  double dVar1;
  Matrix local_110;
  
  Matrix::transpose(&this->super_Matrix);
  Matrix::operator[](&local_110,&this->super_Matrix,1);
  dVar1 = Matrix::getSum(&local_110);
  Matrix::~Matrix(&local_110);
  Matrix::transpose(&this->super_Matrix);
  return dVar1;
}

Assistant:

virtual double getSum() {
		transpose();
		double d = operator[](1).getSum();
		transpose();
		return d;
	}